

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trafficlights.cpp
# Opt level: O2

void __thiscall TrafficLights::run(TrafficLights *this)

{
  if (this->_state != (TrafficLightsState *)0x0) {
    present(this);
    do {
      usleep(1000000);
      (*this->_state->_vptr_TrafficLightsState[3])(this->_state,this);
      present(this);
    } while( true );
  }
  return;
}

Assistant:

void TrafficLights::run()
{
	if (!_state)
		return;

	present();

	while(1) {
		usleep(INTERVAL);
		_state->nextState(this);
		present();
	}
}